

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR.cpp
# Opt level: O1

void __thiscall
lr_grammar::GrammarLR::update_elem
          (GrammarLR *this,int elemIndex,int begin,int end,
          vector<int,_std::allocator<int>_> *factory)

{
  vector<int,std::allocator<int>> *pvVar1;
  iterator iVar2;
  pointer pEVar3;
  void *pvVar4;
  int iVar5;
  long *plVar6;
  ulong uVar7;
  int *piVar8;
  size_type *psVar9;
  long lVar10;
  pointer piVar11;
  long lVar12;
  Express *pEVar13;
  pointer pEVar14;
  ulong uVar15;
  int newIndex;
  vector<int,_std::allocator<int>_> t;
  stringstream ss;
  int local_254;
  vector<int,_std::allocator<int>_> *local_250;
  vector<int,_std::allocator<int>_> local_248;
  ulong local_220;
  long local_218;
  int local_20c;
  string local_208;
  Express local_1e8;
  Express local_1d0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_250 = factory;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  pEVar14 = (this->elements).
            super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
            _M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::stringbuf::str();
  local_220 = (ulong)(uint)begin;
  plVar6 = (long *)std::__cxx11::string::replace
                             ((ulong)&local_248,0,(char *)0x0,
                              (ulong)pEVar14[elemIndex].super_Elem.name._M_dataplus._M_p);
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_208.field_2._M_allocated_capacity = *psVar9;
    local_208.field_2._8_8_ = plVar6[3];
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  }
  else {
    local_208.field_2._M_allocated_capacity = *psVar9;
    local_208._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_208._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  iVar5 = add_elem(this,&local_208,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  uVar7 = local_220;
  if ((pointer *)
      local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      &local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage) {
    operator_delete(local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  lVar10 = (long)(int)uVar7;
  lVar12 = *(long *)&(this->elements).
                     super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                     ._M_impl.super__Vector_impl_data._M_start[elemIndex].expression_of_set.
                     super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                     ._M_impl.super__Vector_impl_data;
  uVar7 = (long)(local_250->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(local_250->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
  local_254 = iVar5;
  if (*(long *)(lVar12 + 8 + lVar10 * 0x18) - *(long *)(lVar12 + lVar10 * 0x18) == uVar7) {
    local_20c = -1;
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_248,(iterator)0x0,&local_20c);
  }
  else {
    iVar5 = (int)(uVar7 >> 2);
    lVar12 = *(long *)&(this->elements).
                       super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                       ._M_impl.super__Vector_impl_data._M_start[elemIndex].expression_of_set.
                       super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                       ._M_impl.super__Vector_impl_data;
    if ((ulong)(long)iVar5 <
        (ulong)(*(long *)(lVar12 + 8 + lVar10 * 0x18) - *(long *)(lVar12 + lVar10 * 0x18) >> 2)) {
      pEVar13 = (Express *)(lVar12 + lVar10 * 0x18);
      uVar7 = (ulong)iVar5;
      do {
        piVar8 = base_grammar::Express::operator[](pEVar13,(int)uVar7);
        if (local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_248,
                     (iterator)
                     local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,piVar8);
        }
        else {
          *local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = *piVar8;
          local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        uVar7 = uVar7 + 1;
        pEVar13 = (Express *)
                  (*(long *)&(this->elements).
                             super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                             ._M_impl.super__Vector_impl_data._M_start[elemIndex].expression_of_set.
                             super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                             ._M_impl.super__Vector_impl_data + lVar10 * 0x18);
      } while (uVar7 < (ulong)((long)(pEVar13->expression).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)(pEVar13->expression).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start >> 2));
    }
  }
  lVar12 = (long)local_254;
  pEVar14 = (this->elements).
            super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_218 = lVar10 * 3;
  base_grammar::Express::Express(&local_1e8,&local_248);
  std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::push_back
            (&pEVar14[lVar12].expression_of_set,(value_type *)&local_1e8);
  uVar7 = local_220;
  if (local_1e8.expression.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.expression.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  iVar5 = (int)uVar7 + 1;
  if (iVar5 < end) {
    lVar12 = (long)iVar5;
    do {
      if (local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      iVar5 = (int)((ulong)((long)(local_250->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                  .super__Vector_impl_data._M_finish -
                           (long)(local_250->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start) >> 2);
      pEVar14 = (this->elements).
                super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar10 = *(long *)&pEVar14[elemIndex].expression_of_set.
                         super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                         ._M_impl.super__Vector_impl_data;
      if ((ulong)(long)iVar5 <
          (ulong)(*(long *)(lVar10 + 8 + lVar12 * 0x18) - *(long *)(lVar10 + lVar12 * 0x18) >> 2)) {
        pEVar13 = (Express *)(lVar10 + lVar12 * 0x18);
        uVar7 = (ulong)iVar5;
        do {
          piVar8 = base_grammar::Express::operator[](pEVar13,(int)uVar7);
          if (local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_248,
                       (iterator)
                       local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,piVar8);
          }
          else {
            *local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish = *piVar8;
            local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          uVar7 = uVar7 + 1;
          pEVar14 = (this->elements).
                    super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pEVar13 = (Express *)
                    (*(long *)&pEVar14[elemIndex].expression_of_set.
                               super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                               ._M_impl.super__Vector_impl_data + lVar12 * 0x18);
        } while (uVar7 < (ulong)((long)(pEVar13->expression).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                 (long)(pEVar13->expression).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start >> 2));
      }
      lVar10 = (long)local_254;
      base_grammar::Express::Express(&local_1d0,&local_248);
      std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::push_back
                (&pEVar14[lVar10].expression_of_set,(value_type *)&local_1d0);
      if (local_1d0.expression.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1d0.expression.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      lVar12 = lVar12 + 1;
    } while ((int)lVar12 != end);
  }
  lVar12 = *(long *)&(this->elements).
                     super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                     ._M_impl.super__Vector_impl_data._M_start[elemIndex].expression_of_set.
                     super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                     ._M_impl.super__Vector_impl_data;
  lVar10 = *(long *)(lVar12 + local_218 * 8);
  if (*(long *)(lVar12 + 8 + local_218 * 8) != lVar10) {
    *(long *)(lVar12 + local_218 * 8 + 8) = lVar10;
  }
  piVar11 = (local_250->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((local_250->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar11) {
    lVar12 = 0;
    uVar7 = 0;
    do {
      pvVar1 = (vector<int,std::allocator<int>> *)
               (*(long *)&(this->elements).
                          super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                          ._M_impl.super__Vector_impl_data._M_start[elemIndex].expression_of_set.
                          super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                          ._M_impl.super__Vector_impl_data + local_218 * 8);
      iVar2._M_current = *(int **)(pvVar1 + 8);
      if (iVar2._M_current == *(int **)(pvVar1 + 0x10)) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (pvVar1,iVar2,(int *)((long)piVar11 + lVar12));
      }
      else {
        *iVar2._M_current = *(int *)((long)piVar11 + lVar12);
        *(int **)(pvVar1 + 8) = iVar2._M_current + 1;
      }
      uVar7 = uVar7 + 1;
      piVar11 = (local_250->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar12 = lVar12 + 4;
    } while (uVar7 < (ulong)((long)(local_250->super__Vector_base<int,_std::allocator<int>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)piVar11 >> 2));
  }
  pvVar1 = (vector<int,std::allocator<int>> *)
           (*(long *)&(this->elements).
                      super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                      ._M_impl.super__Vector_impl_data._M_start[elemIndex].expression_of_set.
                      super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                      ._M_impl.super__Vector_impl_data + local_218 * 8);
  iVar2._M_current = *(int **)(pvVar1 + 8);
  if (iVar2._M_current == *(int **)(pvVar1 + 0x10)) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(pvVar1,iVar2,&local_254);
  }
  else {
    *iVar2._M_current = local_254;
    *(int **)(pvVar1 + 8) = iVar2._M_current + 1;
  }
  iVar5 = end - (int)local_220;
  local_250 = (vector<int,_std::allocator<int>_> *)CONCAT44(local_250._4_4_,iVar5);
  uVar15 = (ulong)end;
  pEVar14 = (this->elements).
            super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar12 = *(long *)&pEVar14[elemIndex].expression_of_set.
                     super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                     ._M_impl.super__Vector_impl_data;
  uVar7 = ((long)*(pointer *)
                  ((long)&pEVar14[elemIndex].expression_of_set.
                          super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                          ._M_impl + 8) - lVar12 >> 3) * -0x5555555555555555;
  if (uVar15 <= uVar7 && uVar7 - uVar15 != 0) {
    lVar10 = uVar15 * 0x18;
    do {
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)(lVar12 + lVar10) + (1 - (long)iVar5),
                 (vector<int,_std::allocator<int>_> *)(lVar12 + lVar10));
      uVar15 = uVar15 + 1;
      pEVar14 = (this->elements).
                super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar12 = *(long *)&pEVar14[elemIndex].expression_of_set.
                         super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                         ._M_impl.super__Vector_impl_data;
      uVar7 = ((long)*(pointer *)
                      ((long)&pEVar14[elemIndex].expression_of_set.
                              super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                              ._M_impl + 8) - lVar12 >> 3) * -0x5555555555555555;
      lVar10 = lVar10 + 0x18;
    } while (uVar15 <= uVar7 && uVar7 - uVar15 != 0);
  }
  if (1 < (int)local_250) {
    iVar5 = ~(uint)local_220 + end;
    do {
      pEVar14 = (this->elements).
                super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pEVar3 = *(pointer *)
                ((long)&pEVar14[elemIndex].expression_of_set.
                        super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                        ._M_impl + 8);
      *(pointer *)
       ((long)&pEVar14[elemIndex].expression_of_set.
               super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>.
               _M_impl + 8) = pEVar3 + -1;
      pvVar4 = *(void **)&pEVar3[-1].super_Express.expression.
                          super__Vector_base<int,_std::allocator<int>_>;
      if (pvVar4 != (void *)0x0) {
        operator_delete(pvVar4);
      }
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  if (local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void GrammarLR::update_elem(int elemIndex, int begin, int end, vector<int>& factory){


    stringstream ss;
    ss << elements.size();
    int newIndex = add_elem(elements[elemIndex].name + ss.str(), false);

    //先对新的式子添加表达式,将begin到end添加的
    //产生空串的只有第一个begin有这个倾向，别的没有这个倾向,将begin单独拿出来作为特例
    vector<int> t;
    t.clear();
    if (elements[elemIndex].expression_of_set[begin].expression.size() == factory.size()){
        t.push_back(-1);
    }
    else
    {
        for (int i = factory.size(); i < elements[elemIndex].expression_of_set[begin].expression.size(); i++){
            t.push_back(elements[elemIndex].expression_of_set[begin][i]);
        }
    }
    elements[newIndex].add_expression(t);

    for (int i = begin + 1; i < end; i++){
        t.clear();
        for (int j = factory.size(); j < elements[elemIndex].expression_of_set[i].expression.size(); j++){
            t.push_back(elements[elemIndex].expression_of_set[i][j]);
        }
        elements[newIndex].add_expression(t);
    }


    //修改老元素了
    //1. 在begin下面放下结果
    elements[elemIndex].expression_of_set[begin].expression.clear();
    for (int i = 0; i < factory.size(); i++){
        elements[elemIndex].expression_of_set[begin].expression.push_back(factory[i]);
    }
    elements[elemIndex].expression_of_set[begin].expression.push_back(newIndex);

    //后面的元素提前
    int moveDistance = end - begin;
    for (int i = end; i < elements[elemIndex].expression_of_set.size(); i++){
        elements[elemIndex].expression_of_set[i - moveDistance + 1] = elements[elemIndex].expression_of_set[i];
    }

    //清楚元素，共清楚moveDistance-1个
    for (int i = 0; i < moveDistance - 1; i++){
        elements[elemIndex].expression_of_set.pop_back();
    }
}